

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cc
# Opt level: O1

void __thiscall UdpSocket::~UdpSocket(UdpSocket *this)

{
  sockaddr_in *psVar1;
  fd_set *pfVar2;
  timeval *ptVar3;
  
  if (this->_socket != -1) {
    close(this->_socket);
  }
  psVar1 = (this->_read_addr)._M_t.
           super___uniq_ptr_impl<sockaddr_in,_std::default_delete<sockaddr_in>_>._M_t.
           super__Tuple_impl<0UL,_sockaddr_in_*,_std::default_delete<sockaddr_in>_>.
           super__Head_base<0UL,_sockaddr_in_*,_false>._M_head_impl;
  if (psVar1 != (sockaddr_in *)0x0) {
    operator_delete(psVar1,0x10);
  }
  (this->_read_addr)._M_t.super___uniq_ptr_impl<sockaddr_in,_std::default_delete<sockaddr_in>_>._M_t
  .super__Tuple_impl<0UL,_sockaddr_in_*,_std::default_delete<sockaddr_in>_>.
  super__Head_base<0UL,_sockaddr_in_*,_false>._M_head_impl = (sockaddr_in *)0x0;
  pfVar2 = (this->_readset)._M_t.super___uniq_ptr_impl<fd_set,_std::default_delete<fd_set>_>._M_t.
           super__Tuple_impl<0UL,_fd_set_*,_std::default_delete<fd_set>_>.
           super__Head_base<0UL,_fd_set_*,_false>._M_head_impl;
  if (pfVar2 != (fd_set *)0x0) {
    operator_delete(pfVar2,0x80);
  }
  (this->_readset)._M_t.super___uniq_ptr_impl<fd_set,_std::default_delete<fd_set>_>._M_t.
  super__Tuple_impl<0UL,_fd_set_*,_std::default_delete<fd_set>_>.
  super__Head_base<0UL,_fd_set_*,_false>._M_head_impl = (fd_set *)0x0;
  ptVar3 = (this->_read_time)._M_t.super___uniq_ptr_impl<timeval,_std::default_delete<timeval>_>.
           _M_t.super__Tuple_impl<0UL,_timeval_*,_std::default_delete<timeval>_>.
           super__Head_base<0UL,_timeval_*,_false>._M_head_impl;
  if (ptVar3 != (timeval *)0x0) {
    operator_delete(ptVar3,0x10);
  }
  (this->_read_time)._M_t.super___uniq_ptr_impl<timeval,_std::default_delete<timeval>_>._M_t.
  super__Tuple_impl<0UL,_timeval_*,_std::default_delete<timeval>_>.
  super__Head_base<0UL,_timeval_*,_false>._M_head_impl = (timeval *)0x0;
  return;
}

Assistant:

UdpSocket::~UdpSocket()
{
	if (_socket != INVALID_SOCKET) {
#ifdef _WIN32
		closesocket(_socket);
#else
		close(_socket);
#endif
	}
}